

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertex_list.c
# Opt level: O0

bool_t prf_vertex_list_load_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  ushort uVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  void *pvVar4;
  bfile_t *in_RDX;
  long *in_RSI;
  ushort *in_RDI;
  uint32_t *ptr;
  int count;
  int num;
  bfile_t *in_stack_ffffffffffffffd0;
  bfile_t *bfile_00;
  uint in_stack_ffffffffffffffdc;
  int iVar5;
  bool_t local_4;
  
  uVar2 = bf_get_uint16_be(in_stack_ffffffffffffffd0);
  *in_RDI = uVar2;
  if (*in_RDI == prf_vertex_list_info.opcode) {
    uVar2 = bf_get_uint16_be(in_stack_ffffffffffffffd0);
    in_RDI[1] = uVar2;
    if ((4 < in_RDI[1]) && (*(long *)(in_RDI + 4) == 0)) {
      if (*(short *)(*in_RSI + 8) == 0) {
        pvVar4 = malloc((long)(int)(in_RDI[1] - 4));
        *(void **)(in_RDI + 4) = pvVar4;
      }
      else {
        pvVar4 = pool_malloc((pool_t)((ulong)in_RSI >> 0x30),(int)in_RSI);
        *(void **)(in_RDI + 4) = pvVar4;
      }
      if (*(long *)(in_RDI + 4) == 0) {
        prf_error(9,"memory allocation problem (returned NULL)");
        bf_rewind(in_RDX,in_stack_ffffffffffffffdc);
        return 0;
      }
    }
    bfile_00 = *(bfile_t **)(in_RDI + 4);
    uVar1 = in_RDI[1];
    for (iVar5 = 0; iVar5 < (int)(uVar1 - 4) / 4; iVar5 = iVar5 + 1) {
      uVar3 = bf_get_uint32_be(bfile_00);
      *(uint32_t *)(&bfile_00->flags + (long)iVar5 * 2) = uVar3;
    }
    local_4 = 1;
  }
  else {
    prf_error(9,"tried vertex list load method on node of type %d.",(ulong)*in_RDI);
    bf_rewind(in_RDX,in_stack_ffffffffffffffdc);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static
bool_t
prf_vertex_list_load_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int num, count;
    uint32_t * ptr;

    assert( node != NULL && state != NULL && bfile != NULL );

    node->opcode = bf_get_uint16_be( bfile );
    if ( node->opcode != prf_vertex_list_info.opcode ) {
        prf_error( 9, "tried vertex list load method on node of type %d.",
            node->opcode );
        bf_rewind( bfile, 2 );
        return FALSE;
    }

    node->length = bf_get_uint16_be( bfile );

    if ( node->length > 4 && node->data == NULL ) { /* not preallocated */
        assert( state->model != NULL );
        if ( state->model->mempool_id == 0 )
            node->data = (uint8_t *)malloc( node->length - 4 );
        else
            node->data = (uint8_t *)pool_malloc( state->model->mempool_id,
                node->length - 4 );
        if ( node->data == NULL ) {
            prf_error( 9, "memory allocation problem (returned NULL)" );
            bf_rewind( bfile, 4 );
            return FALSE;
        }
    }

    ptr = (uint32_t *) node->data;
    num = 0;
    count = (node->length - 4) / 4;
    while ( num < count ) {
        ptr[num] = bf_get_uint32_be( bfile );
        num++;
    }

    return TRUE;
}